

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O3

int ndiSocketWrite(NDISocketHandle socket,char *data,int length)

{
  ssize_t sVar1;
  uint uVar2;
  
  if (length == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      sVar1 = send(socket,data + uVar2,(long)(int)(length - uVar2),0x4000);
      if ((int)sVar1 < 0) {
        return -1;
      }
      uVar2 = uVar2 + (int)sVar1;
    } while ((int)uVar2 < length);
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiSocketWrite(NDISocketHandle socket, const char* data, int length)
{
  if (length == 0)
  {
    // nothing to send.
    return 0;
  }

  const char* buffer = reinterpret_cast<const char*>(data);
  int total = 0;
  do
  {
    int flags;

    // On unix boxes if the client disconnects and the server attempts
    // to send data through the socket then the application crashes
    // due to SIGPIPE signal. Disable the signal to prevent crash.
#if defined(MSG_NOSIGNAL) // For Linux > 2.2
    flags = MSG_NOSIGNAL;
#else
    flags = 0;
#endif
    int n = send(socket, buffer + total, length - total, flags);
    if (n < 0)
    {
      return -1;
    }
    total += n;
  }
  while (total < length);
  return total;
}